

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Gia_Man_t *
Gia_ManLutBalance(Gia_Man_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  Tim_Man_t *p_00;
  int *__ptr;
  int iVar1;
  abctime aVar2;
  Tim_Man_t *pTVar3;
  Gia_Man_t *pGVar4;
  Str_Ntk_t *p_01;
  Gia_Man_t *p_02;
  abctime aVar5;
  
  aVar2 = Abc_Clock();
  if ((((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
      (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)) ||
     (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    p_01 = Str_ManNormalize(p);
    pGVar4 = Str_NtkBalance(p,p_01,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
    Gia_ManTransferTiming(pGVar4,p);
  }
  else {
    p_00 = (Tim_Man_t *)p->pManTime;
    pTVar3 = Tim_ManDup(p_00,0x10);
    p->pManTime = pTVar3;
    pGVar4 = Gia_ManDupUnnormalize(p);
    if (pGVar4 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
    Gia_ManTransferTiming(pGVar4,p);
    p_01 = Str_ManNormalize(pGVar4);
    p_02 = Str_NtkBalance(pGVar4,p_01,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
    Gia_ManTransferTiming(p_02,pGVar4);
    Gia_ManStop(pGVar4);
    pGVar4 = Gia_ManDupNormalize(p_02,0);
    Gia_ManTransferTiming(pGVar4,p_02);
    Gia_ManStop(p_02);
    Tim_ManStop((Tim_Man_t *)pGVar4->pManTime);
    pGVar4->pManTime = p_00;
    iVar1 = Gia_ManIsNormalized(pGVar4);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x57b,"Gia_Man_t *Gia_ManLutBalance(Gia_Man_t *, int, int, int, int, int)");
    }
  }
  if (fVerbose != 0) {
    aVar5 = Abc_Clock();
    iVar1 = 0x809ec9;
    printf("Network contains %d ands, %d xors, %d muxes (%d trees in %d groups).  ",
           (ulong)(uint)p_01->nObjCount[3],(ulong)(uint)p_01->nObjCount[4],
           (ulong)(uint)p_01->nObjCount[5],(ulong)(uint)p_01->nTrees,(ulong)(uint)p_01->nGroups);
    Abc_Print(iVar1,"%s =","Time");
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar5 - aVar2) / 1000000.0);
  }
  __ptr = (p_01->vFanins).pArray;
  if (__ptr != (int *)0x0) {
    free(__ptr);
    (p_01->vFanins).pArray = (int *)0x0;
  }
  free(p_01->pObjs);
  free(p_01);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        Tim_Man_t * pTimOld = (Tim_Man_t *)p->pManTime;
        p->pManTime = Tim_ManDup( pTimOld, 16 );
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // optimize
        pNtk = Str_ManNormalize( p );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, 0 );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // cleanup
        Tim_ManStop( (Tim_Man_t *)pNew->pManTime );
        pNew->pManTime = pTimOld;
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        pNtk = Str_ManNormalize( p );
    //    Str_NtkPrintGroups( pNtk );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
    }
    if ( fVerbose )
        Str_NtkPs( pNtk, Abc_Clock() - clk );
    Str_NtkDelete( pNtk );   
    return pNew;
}